

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void square_free_trap(chunk_conflict2 *c,loc_conflict grid)

{
  trap *ptVar1;
  trap *local_28;
  trap *trap;
  trap *next;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  local_28 = square_trap((chunk *)c,grid);
  while (local_28 != (trap *)0x0) {
    ptVar1 = local_28->next;
    mem_free(local_28);
    local_28 = ptVar1;
  }
  return;
}

Assistant:

void square_free_trap(struct chunk *c, struct loc grid)
{
	struct trap *next, *trap = square_trap(c, grid);

	while (trap) {
		next = trap->next;
		mem_free(trap);
		trap = next;
	}
}